

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter.h
# Opt level: O2

uint32_t __thiscall Rel::toDot(Rel *this,stringstream *ss)

{
  element_type *peVar1;
  ostream *poVar2;
  ostream *poVar3;
  string local_50 [32];
  
  poVar3 = (ostream *)(ss + 0x10);
  poVar2 = std::operator<<(poVar3,'\t');
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,' ');
  poVar2 = std::operator<<(poVar2,"[shape=box, label=\"Rel\\nop: ");
  (**((this->super_Logical).super_Expr.op.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>.
     _M_ptr)->_vptr_Token)(local_50);
  poVar2 = std::operator<<(poVar2,local_50);
  poVar2 = std::operator<<(poVar2,"\"");
  poVar2 = std::operator<<(poVar2,", fillcolor=\"#e3f2fd\", style=filled]");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string(local_50);
  poVar2 = std::operator<<(poVar3,'\t');
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," -> ");
  peVar1 = (this->super_Logical).expr1.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar1->super_Node)._vptr_Node[1])(peVar1,ss);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar3 = std::operator<<(poVar3,'\t');
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3," -> ");
  peVar1 = (this->super_Logical).expr2.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar1->super_Node)._vptr_Node[1])(peVar1,ss);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  return (uint32_t)this;
}

Assistant:

uint32_t toDot(std::stringstream& ss) override {
		uint32_t i = hash(this);

		ss << '\t' << i << ' ' << "[shape=box, label=\"Rel\\nop: " << op->toString() << "\"" << ", fillcolor=\"#e3f2fd\", style=filled]" << std::endl;

		ss << '\t' << i << " -> " << expr1->toDot(ss) << std::endl;;
		ss << '\t' << i << " -> " << expr2->toDot(ss) << std::endl;;

		return i;
	}